

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# esextcGeometryShaderLimits.cpp
# Opt level: O2

void __thiscall
glcts::GeometryShaderLimitsRenderingBase::initTest(GeometryShaderLimitsRenderingBase *this)

{
  ostringstream *this_00;
  bool bVar1;
  int iVar2;
  uint uVar3;
  deUint32 dVar4;
  GLuint GVar5;
  undefined4 extraout_var;
  TestError *this_01;
  pointer_____offset_0x10___ *ppuVar7;
  undefined8 uVar8;
  GLfloat required_point_size;
  GLfloat point_size_range [2];
  undefined1 local_1a8 [384];
  long lVar6;
  
  if ((this->super_TestCaseBase).m_is_geometry_shader_extension_supported == false) {
    this_01 = (TestError *)__cxa_allocate_exception(0x38);
    tcu::NotSupportedError::NotSupportedError
              ((NotSupportedError *)this_01,"Geometry shader functionality not supported, skipping",
               fixed_sample_locations_values + 1,
               "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/geometry_shader/esextcGeometryShaderLimits.cpp"
               ,0x409);
  }
  else if ((this->super_TestCaseBase).m_is_gpu_shader5_supported == false) {
    this_01 = (TestError *)__cxa_allocate_exception(0x38);
    tcu::NotSupportedError::NotSupportedError
              ((NotSupportedError *)this_01,"GPU shader5 functionality not supported, skipping",
               fixed_sample_locations_values + 1,
               "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/geometry_shader/esextcGeometryShaderLimits.cpp"
               ,0x40f);
  }
  else {
    iVar2 = (*((this->super_TestCaseBase).m_context)->m_renderCtx->_vptr_RenderContext[3])();
    lVar6 = CONCAT44(extraout_var,iVar2);
    point_size_range[0] = 0.0;
    point_size_range[1] = 0.0;
    required_point_size = 0.0;
    uVar3 = (*((this->super_TestCaseBase).m_context)->m_renderCtx->_vptr_RenderContext[2])();
    uVar8 = 0xb12;
    if ((uVar3 & 0x300) == 0) {
      uVar8 = 0x846d;
    }
    (**(code **)(lVar6 + 0x818))(uVar8,point_size_range);
    dVar4 = (**(code **)(lVar6 + 0x800))();
    glu::checkError(dVar4,"glGetFloatv() call failed",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/geometry_shader/esextcGeometryShaderLimits.cpp"
                    ,0x422);
    (*(this->super_TestCaseBase).super_TestCase.super_TestNode._vptr_TestNode[8])
              (this,&required_point_size);
    if (required_point_size <= point_size_range[1]) {
      uVar3 = (*((this->super_TestCaseBase).m_context)->m_renderCtx->_vptr_RenderContext[2])();
      if ((uVar3 & 0x300) != 0) {
        (**(code **)(lVar6 + 0x5e0))(0x8642);
      }
      (*(this->super_TestCaseBase).super_TestCase.super_TestNode._vptr_TestNode[9])
                (this,&this->m_fragment_shader_parts,&this->m_n_fragment_shader_parts,
                 &this->m_geometry_shader_parts,&this->m_n_geometry_shader_parts,
                 &this->m_vertex_shader_parts,&this->m_n_vertex_shader_parts);
      GVar5 = (**(code **)(lVar6 + 0x3c8))();
      this->m_program_object_id = GVar5;
      GVar5 = (**(code **)(lVar6 + 0x3f0))(0x8b30);
      this->m_fragment_shader_id = GVar5;
      GVar5 = (**(code **)(lVar6 + 0x3f0))((this->super_TestCaseBase).m_glExtTokens.GEOMETRY_SHADER)
      ;
      this->m_geometry_shader_id = GVar5;
      GVar5 = (**(code **)(lVar6 + 0x3f0))(0x8b31);
      this->m_vertex_shader_id = GVar5;
      dVar4 = (**(code **)(lVar6 + 0x800))();
      glu::checkError(dVar4,"Failed to create program or shader object(s)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/geometry_shader/esextcGeometryShaderLimits.cpp"
                      ,0x43f);
      bVar1 = TestCaseBase::buildProgram
                        (&this->super_TestCaseBase,this->m_program_object_id,
                         this->m_fragment_shader_id,this->m_n_fragment_shader_parts,
                         this->m_fragment_shader_parts,this->m_geometry_shader_id,
                         this->m_n_geometry_shader_parts,this->m_geometry_shader_parts,
                         this->m_vertex_shader_id,this->m_n_vertex_shader_parts,
                         this->m_vertex_shader_parts,(bool *)0x0);
      if (bVar1) {
        (**(code **)(lVar6 + 0x708))(1,&this->m_vertex_array_object_id);
        (**(code **)(lVar6 + 0xd8))(this->m_vertex_array_object_id);
        dVar4 = (**(code **)(lVar6 + 0x800))();
        glu::checkError(dVar4,"Could not create vertex array object",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/geometry_shader/esextcGeometryShaderLimits.cpp"
                        ,0x44e);
        (*(this->super_TestCaseBase).super_TestCase.super_TestNode._vptr_TestNode[7])
                  (this,&this->m_texture_format,&this->m_texture_read_format,
                   &this->m_texture_read_type,&this->m_texture_width,&this->m_texture_height,
                   &this->m_texture_pixel_size);
        (**(code **)(lVar6 + 0x6f8))(1,&this->m_color_texture_id);
        (**(code **)(lVar6 + 0x6d0))(1,&this->m_framebuffer_object_id);
        dVar4 = (**(code **)(lVar6 + 0x800))();
        glu::checkError(dVar4,"Could not create framebuffer",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/geometry_shader/esextcGeometryShaderLimits.cpp"
                        ,0x458);
        bVar1 = TestCaseBase::setupFramebufferWithTextureAsAttachment
                          (&this->super_TestCaseBase,this->m_framebuffer_object_id,
                           this->m_color_texture_id,this->m_texture_format,this->m_texture_width,
                           this->m_texture_height);
        if (bVar1) {
          return;
        }
        this_01 = (TestError *)__cxa_allocate_exception(0x38);
        tcu::TestError::TestError
                  (this_01,"Failed to setup framebuffer",(char *)0x0,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/geometry_shader/esextcGeometryShaderLimits.cpp"
                   ,0x45d);
      }
      else {
        this_01 = (TestError *)__cxa_allocate_exception(0x38);
        tcu::TestError::TestError
                  (this_01,"Could not create program from valid vertex/geometry/fragment shader",
                   (char *)0x0,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/geometry_shader/esextcGeometryShaderLimits.cpp"
                   ,0x447);
      }
      ppuVar7 = &tcu::TestError::typeinfo;
      goto LAB_00ce3f2c;
    }
    local_1a8._0_8_ = ((this->super_TestCaseBase).super_TestCase.super_TestNode.m_testCtx)->m_log;
    this_00 = (ostringstream *)(local_1a8 + 8);
    std::__cxx11::ostringstream::ostringstream(this_00);
    std::operator<<((ostream *)this_00,"Test requires a minimum maximum point size of: ");
    std::ostream::operator<<(this_00,required_point_size);
    std::operator<<((ostream *)this_00,", implementation reports a maximum of : ");
    std::ostream::operator<<(this_00,point_size_range[1]);
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_1a8,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream(this_00);
    this_01 = (TestError *)__cxa_allocate_exception(0x38);
    tcu::NotSupportedError::NotSupportedError
              ((NotSupportedError *)this_01,"Required point size is not supported",
               fixed_sample_locations_values + 1,
               "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/geometry_shader/esextcGeometryShaderLimits.cpp"
               ,0x42d);
  }
  ppuVar7 = &tcu::NotSupportedError::typeinfo;
LAB_00ce3f2c:
  __cxa_throw(this_01,ppuVar7,tcu::Exception::~Exception);
}

Assistant:

void GeometryShaderLimitsRenderingBase::initTest()
{
	/* This test should only run if EXT_geometry_shader is supported */
	if (!m_is_geometry_shader_extension_supported)
	{
		throw tcu::NotSupportedError(GEOMETRY_SHADER_EXTENSION_NOT_SUPPORTED, "", __FILE__, __LINE__);
	}

	/* Query on support of EXT_gpu_shader5 */
	if (!m_is_gpu_shader5_supported)
	{
		throw tcu::NotSupportedError(GPU_SHADER5_EXTENSION_NOT_SUPPORTED, "", __FILE__, __LINE__);
	}

	/* Retrieve ES entry-points */
	const glw::Functions& gl = m_context.getRenderContext().getFunctions();

	/* Verify that point size range is supported */
	glw::GLfloat point_size_range[2] = { 0 };
	glw::GLfloat required_point_size = 0.0f;

	if (!glu::isContextTypeES(m_context.getRenderContext().getType()))
	{
		gl.getFloatv(GL_POINT_SIZE_RANGE, point_size_range);
	}
	else
	{
		gl.getFloatv(GL_ALIASED_POINT_SIZE_RANGE, point_size_range);
	}

	GLU_EXPECT_NO_ERROR(gl.getError(), "glGetFloatv() call failed");

	getRequiredPointSize(required_point_size);

	if (required_point_size > point_size_range[1])
	{
		m_testCtx.getLog() << tcu::TestLog::Message
						   << "Test requires a minimum maximum point size of: " << required_point_size
						   << ", implementation reports a maximum of : " << point_size_range[1]
						   << tcu::TestLog::EndMessage;

		throw tcu::NotSupportedError("Required point size is not supported", "", __FILE__, __LINE__);
	}
	if (!glu::isContextTypeES(m_context.getRenderContext().getType()))
	{
		gl.enable(GL_PROGRAM_POINT_SIZE);
	}

	/* Get shaders code from child class */
	getShaderParts(m_fragment_shader_parts, m_n_fragment_shader_parts, m_geometry_shader_parts,
				   m_n_geometry_shader_parts, m_vertex_shader_parts, m_n_vertex_shader_parts);

	/* Create program and shaders */
	m_program_object_id = gl.createProgram();

	m_fragment_shader_id = gl.createShader(GL_FRAGMENT_SHADER);
	m_geometry_shader_id = gl.createShader(m_glExtTokens.GEOMETRY_SHADER);
	m_vertex_shader_id   = gl.createShader(GL_VERTEX_SHADER);

	GLU_EXPECT_NO_ERROR(gl.getError(), "Failed to create program or shader object(s)");

	/* Build program */
	if (false == buildProgram(m_program_object_id, m_fragment_shader_id, m_n_fragment_shader_parts,
							  m_fragment_shader_parts, m_geometry_shader_id, m_n_geometry_shader_parts,
							  m_geometry_shader_parts, m_vertex_shader_id, m_n_vertex_shader_parts,
							  m_vertex_shader_parts))
	{
		TCU_FAIL("Could not create program from valid vertex/geometry/fragment shader");
	}

	/* Set up a vertex array object */
	gl.genVertexArrays(1, &m_vertex_array_object_id);
	gl.bindVertexArray(m_vertex_array_object_id);

	GLU_EXPECT_NO_ERROR(gl.getError(), "Could not create vertex array object");

	/* Get framebuffer details */
	getFramebufferDetails(m_texture_format, m_texture_read_format, m_texture_read_type, m_texture_width,
						  m_texture_height, m_texture_pixel_size);

	/* Set up texture object and a FBO */
	gl.genTextures(1, &m_color_texture_id);
	gl.genFramebuffers(1, &m_framebuffer_object_id);

	GLU_EXPECT_NO_ERROR(gl.getError(), "Could not create framebuffer");

	if (false == setupFramebufferWithTextureAsAttachment(m_framebuffer_object_id, m_color_texture_id, m_texture_format,
														 m_texture_width, m_texture_height))
	{
		TCU_FAIL("Failed to setup framebuffer");
	}
}